

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conv2d.cpp
# Opt level: O3

void load_model(test_model *model,bool use_gpu)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  void *pvVar3;
  char cVar4;
  int iVar5;
  void *__s;
  void *__s_00;
  void *__s_01;
  long lVar6;
  ggml_backend_t pgVar7;
  ggml_backend_buffer_t pgVar8;
  ggml_context *pgVar9;
  ggml_tensor *pgVar10;
  size_t sVar11;
  undefined8 uVar12;
  value_type_conflict1 *__val;
  ulong uVar13;
  value_type_conflict2 *__val_1;
  long lVar14;
  value_type_conflict1 *__val_2;
  float fVar15;
  ggml_tallocr alloc;
  undefined4 uStack_60;
  undefined7 uStack_57;
  undefined1 local_50 [32];
  
  __s = operator_new(0xe10);
  lVar14 = 0;
  memset(__s,0,0xe10);
  do {
    puVar1 = (undefined8 *)((long)__s + lVar14 * 4);
    *puVar1 = 0x4020000040200000;
    puVar1[1] = 0x4020000040200000;
    lVar14 = lVar14 + 4;
  } while (lVar14 != 900);
  __s_00 = operator_new(0x708);
  memset(__s_00,0,0x708);
  ggml_fp32_to_fp16_row(__s,__s_00,900);
  __s_01 = operator_new(0x780);
  lVar14 = 0;
  memset(__s_01,0,0x780);
  do {
    puVar2 = (undefined4 *)((long)__s_01 + lVar14 * 4);
    *puVar2 = 0x3fc00000;
    puVar2[1] = 0x3fc00000;
    puVar2[2] = 0x3fc00000;
    puVar2[3] = 0x3fc00000;
    lVar14 = lVar14 + 4;
  } while (lVar14 != 0x1e0);
  lVar14 = ggml_type_size(1);
  lVar6 = ggml_type_size(0);
  uVar13 = lVar14 * 900 + lVar6 * 0x1e0 + 0x400;
  printf("%s: ggml tensor size    = %d bytes\n","load_model",0x150);
  if ((long)uVar13 < 0) {
    fVar15 = (float)(uVar13 >> 1) + (float)(uVar13 >> 1);
  }
  else {
    fVar15 = (float)(long)uVar13;
  }
  printf("%s: backend buffer size = %0.2f MB\n",
         SUB84((double)(fVar15 * 0.0009765625 * 0.0009765625),0),"load_model");
  iVar5 = ggml_tensor_overhead();
  ggml_log_set(ggml_log_callback_default,0);
  pgVar7 = model->backend;
  if (pgVar7 == (ggml_backend_t)0x0) {
    pgVar7 = (ggml_backend_t)ggml_backend_cpu_init();
    model->backend = pgVar7;
  }
  pgVar8 = (ggml_backend_buffer_t)ggml_backend_alloc_buffer(pgVar7,uVar13);
  iVar5 = iVar5 * 2;
  model->buffer = pgVar8;
  uVar12 = CONCAT71(uStack_57,1);
  uStack_60 = 0;
  pgVar9 = (ggml_context *)ggml_init();
  model->ctx = pgVar9;
  pgVar10 = (ggml_tensor *)ggml_new_tensor_4d(pgVar9,1,3,3,10,10,iVar5,uStack_60,uVar12);
  model->a = pgVar10;
  pgVar10 = (ggml_tensor *)ggml_new_tensor_4d(model->ctx,0,8,6,10,1);
  model->b = pgVar10;
  ggml_tallocr_new(local_50,model->buffer);
  ggml_tallocr_alloc(local_50,model->a);
  cVar4 = ggml_backend_is_cpu(model->backend);
  pgVar10 = model->a;
  if (cVar4 == '\0') {
    uVar12 = ggml_nbytes(pgVar10);
    ggml_backend_tensor_set(pgVar10,__s_00,0,uVar12);
  }
  else {
    pvVar3 = pgVar10->data;
    sVar11 = ggml_nbytes(pgVar10);
    memcpy(pvVar3,__s_00,sVar11);
  }
  ggml_tallocr_alloc(local_50,model->b);
  cVar4 = ggml_backend_is_cpu(model->backend);
  pgVar10 = model->b;
  if (cVar4 == '\0') {
    uVar12 = ggml_nbytes(pgVar10);
    ggml_backend_tensor_set(pgVar10,__s_01,0,uVar12);
  }
  else {
    pvVar3 = pgVar10->data;
    sVar11 = ggml_nbytes(pgVar10);
    memcpy(pvVar3,__s_01,sVar11);
  }
  operator_delete(__s_01,0x780);
  operator_delete(__s_00,0x708);
  operator_delete(__s,0xe10);
  return;
}

Assistant:

void load_model(test_model & model, bool use_gpu = false) {
    // create data
    int KW = 3, KH = 3, IC = 10, OC = 10;
    int IW = 8, IH = 6, N = 1;

    // Initialize adata
    std::vector<float> adata(KW * KH * IC * OC);
    for (int i = 0; i < KW * KH * IC * OC; i++) {
        adata[i] = 2.5f;
    }

    // Convert adata to fp16 format
    std::vector<ggml_fp16_t> hadata(KW * KH * IC * OC);
    ggml_fp32_to_fp16_row(adata.data(), hadata.data(), KW * KH * IC * OC);

    // Initialize bdata
    std::vector<float> bdata(IW * IH * IC * N);
    for (int i = 0; i < IW * IH * IC * N; i++) {
        bdata[i] = 1.5f;
    }

    size_t buffer_size = 0;
    {
        buffer_size += KW * KH * IC * OC * ggml_type_size(GGML_TYPE_F16); // tensor a
        buffer_size += IW * IH * IC * N  * ggml_type_size(GGML_TYPE_F32); // tensor b
        buffer_size += 1024; // overhead
    }

    printf("%s: ggml tensor size    = %d bytes\n", __func__, (int) sizeof(ggml_tensor));
    printf("%s: backend buffer size = %0.2f MB\n", __func__, (buffer_size/ 1024.f/ 1024.f));

    int num_tensors = 2;
    struct ggml_init_params params {
            /*.mem_size   =*/ ggml_tensor_overhead() * num_tensors,
            /*.mem_buffer =*/ NULL,
            /*.no_alloc   =*/ true,
    };

    ggml_log_set(ggml_log_callback_default, nullptr);

    // initialize the backend
#ifdef GGML_USE_CUDA
    if (use_gpu) {
        fprintf(stderr, "%s: using CUDA backend\n", __func__);
        model.backend = ggml_backend_cuda_init(0);
        if (!model.backend) {
            fprintf(stderr, "%s: ggml_backend_cuda_init() failed\n", __func__);
        }
    }
#endif

#ifdef GGML_USE_METAL
    if (use_gpu) {
        fprintf(stderr, "%s: using Metal backend\n", __func__);
        model.backend = ggml_backend_metal_init();
        if (!model.backend) {
            fprintf(stderr, "%s: ggml_backend_metal_init() failed\n", __func__);
        }
    }
#endif

    if(!model.backend) {
        // fallback to CPU backend
        model.backend = ggml_backend_cpu_init();
    }

    model.buffer = ggml_backend_alloc_buffer(model.backend, buffer_size);

    // create context
    model.ctx = ggml_init(params);

    // create tensors
    model.a = ggml_new_tensor_4d(model.ctx, GGML_TYPE_F16,  KW, KH, IC, OC);
    model.b = ggml_new_tensor_4d(model.ctx, GGML_TYPE_F32, IW, IH, IC, N);

    // create a allocator
    struct ggml_tallocr alloc = ggml_tallocr_new(model.buffer);

    // alloc memory
    ggml_tallocr_alloc(&alloc, model.a);

    // load data to buffer
    if(ggml_backend_is_cpu(model.backend)) {
        memcpy(model.a->data, hadata.data(), ggml_nbytes(model.a));
    } else {
        ggml_backend_tensor_set(model.a, hadata.data(), 0, ggml_nbytes(model.a));
    }

    // alloc memory
    ggml_tallocr_alloc(&alloc, model.b);

    if(ggml_backend_is_cpu(model.backend)
#ifdef GGML_USE_METAL
                || ggml_backend_is_metal(model.backend)
#endif
    ) {
        memcpy(model.b->data, bdata.data(), ggml_nbytes(model.b));
    } else {
        ggml_backend_tensor_set(model.b, bdata.data(), 0, ggml_nbytes(model.b));
    }
}